

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnativesocketengine.cpp
# Opt level: O0

bool __thiscall
QNativeSocketEnginePrivate::checkProxy(QNativeSocketEnginePrivate *this,QHostAddress *address)

{
  bool bVar1;
  ProxyType PVar2;
  QAbstractSocket *pQVar3;
  QTcpServer *pQVar4;
  QNativeSocketEnginePrivate *in_RDI;
  long in_FS_OFFSET;
  QTcpServer *server;
  QAbstractSocket *socket;
  QueryType queryType;
  QObject *parent;
  QNetworkProxyQuery query;
  QNetworkProxy proxy;
  undefined4 in_stack_ffffffffffffff58;
  QueryType in_stack_ffffffffffffff5c;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  QAbstractSocket *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  SocketType in_stack_ffffffffffffff74;
  bool local_41;
  QAbstractSocket local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QHostAddress::isLoopback((QHostAddress *)0x25eb9a);
  if (bVar1) {
    local_41 = true;
    goto LAB_0025edce;
  }
  q_func(in_RDI);
  QObject::parent((QObject *)0x25ebbc);
  local_18._8_8_ = 0xaaaaaaaaaaaaaaaa;
  QNetworkProxy::QNetworkProxy((QNetworkProxy *)0x25ebdd);
  pQVar3 = qobject_cast<QAbstractSocket*>((QObject *)0x25ebef);
  if (pQVar3 == (QAbstractSocket *)0x0) {
    pQVar4 = qobject_cast<QTcpServer*>((QObject *)0x25ec8c);
    if (pQVar4 != (QTcpServer *)0x0) {
      QTcpServer::proxy((QTcpServer *)in_stack_ffffffffffffff68);
      QNetworkProxy::operator=
                ((QNetworkProxy *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                 (QNetworkProxy *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      QNetworkProxy::~QNetworkProxy((QNetworkProxy *)0x25eccd);
      goto LAB_0025eceb;
    }
    local_41 = true;
  }
  else {
    in_stack_ffffffffffffff68 = &local_18;
    QAbstractSocket::proxy(in_stack_ffffffffffffff68);
    QNetworkProxy::operator=
              ((QNetworkProxy *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
               (QNetworkProxy *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    QNetworkProxy::~QNetworkProxy((QNetworkProxy *)0x25ec33);
    in_stack_ffffffffffffff74 = QAbstractSocket::socketType((QAbstractSocket *)0x25ec3d);
LAB_0025eceb:
    PVar2 = QNetworkProxy::type((QNetworkProxy *)
                                CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
    if (PVar2 == DefaultProxy) {
      QNetworkProxyQuery::QNetworkProxyQuery((QNetworkProxyQuery *)0x25ed19);
      QNetworkProxyQuery::setQueryType
                ((QNetworkProxyQuery *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60)
                 ,in_stack_ffffffffffffff5c);
      QNetworkProxyFactory::proxyForQuery((QNetworkProxyQuery *)in_stack_ffffffffffffff68);
      QList<QNetworkProxy>::constFirst
                ((QList<QNetworkProxy> *)
                 CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
      QNetworkProxy::operator=
                ((QNetworkProxy *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                 (QNetworkProxy *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      QList<QNetworkProxy>::~QList((QList<QNetworkProxy> *)0x25ed60);
      QNetworkProxyQuery::~QNetworkProxyQuery((QNetworkProxyQuery *)0x25ed6d);
    }
    PVar2 = QNetworkProxy::type((QNetworkProxy *)
                                CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
    if ((PVar2 == DefaultProxy) ||
       (PVar2 = QNetworkProxy::type((QNetworkProxy *)
                                    CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60)),
       PVar2 == NoProxy)) {
      local_41 = true;
    }
    else {
      setError((QNativeSocketEnginePrivate *)
               CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               (SocketError)((ulong)in_stack_ffffffffffffff68 >> 0x20),
               (ErrorString)in_stack_ffffffffffffff68);
      local_41 = false;
    }
  }
  QNetworkProxy::~QNetworkProxy((QNetworkProxy *)0x25edce);
LAB_0025edce:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_41;
}

Assistant:

bool QNativeSocketEnginePrivate::checkProxy(const QHostAddress &address)
{
    if (address.isLoopback())
        return true;

#if !defined(QT_NO_NETWORKPROXY)
    QObject *parent = q_func()->parent();
    QNetworkProxy proxy;
    QNetworkProxyQuery::QueryType queryType = QNetworkProxyQuery::TcpSocket;
    if (QAbstractSocket *socket = qobject_cast<QAbstractSocket *>(parent)) {
        proxy = socket->proxy();
        switch (socket->socketType()) {
        case QAbstractSocket::UdpSocket:
            queryType = QNetworkProxyQuery::UdpSocket;
            break;
        case QAbstractSocket::SctpSocket:
            queryType = QNetworkProxyQuery::SctpSocket;
            break;
        case QAbstractSocket::TcpSocket:
        case QAbstractSocket::UnknownSocketType:
            queryType = QNetworkProxyQuery::TcpSocket;
        }
    } else if (QTcpServer *server = qobject_cast<QTcpServer *>(parent)) {
        proxy = server->proxy();
        queryType = QNetworkProxyQuery::TcpServer;
#ifndef QT_NO_SCTP
        if (qobject_cast<QSctpServer *>(server))
            queryType = QNetworkProxyQuery::SctpServer;
#endif
    } else {
        // no parent -> no proxy
        return true;
    }

    if (proxy.type() == QNetworkProxy::DefaultProxy) {
        // This is similar to what we have in QNetworkProxy::applicationProxy,
        // the only difference is that we provide the correct query type instead of
        // always using TcpSocket unconditionally (this is the default type for
        // QNetworkProxyQuery).
        QNetworkProxyQuery query;
        query.setQueryType(queryType);
        proxy = QNetworkProxyFactory::proxyForQuery(query).constFirst();
    }

    if (proxy.type() != QNetworkProxy::DefaultProxy &&
        proxy.type() != QNetworkProxy::NoProxy) {
        // QNativeSocketEngine doesn't do proxies
        setError(QAbstractSocket::UnsupportedSocketOperationError,
                 QNativeSocketEnginePrivate::InvalidProxyTypeString);
        return false;
    }
#endif

    return true;
}